

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::read_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this)

{
  fstream *pfVar1;
  pointer pcVar2;
  runtime_error *prVar3;
  _Alloc_hider read_bytes;
  array<char,_8UL> thing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pfVar1 = &this->stream_;
  std::istream::read((char *)pfVar1,(long)&local_88);
  check_stream(this,"read");
  if (local_88._M_dataplus._M_p != (pointer)0x1dcc2cc51a415448) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Magic bytes of file do not match. Invalid or corrupt file:","");
    pcVar2 = (this->filename_)._M_pathname._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar2,pcVar2 + (this->filename_)._M_pathname._M_string_length);
    std::operator+(&local_88,&local_48,&local_68);
    std::runtime_error::runtime_error(prVar3,(string *)&local_88);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)pfVar1,(long)&local_88);
  check_stream(this,"read");
  if (local_88._M_dataplus._M_p == (pointer)0xf8f9fafbfcfdfeff) {
    std::istream::read((char *)pfVar1,(long)&local_88);
    check_stream(this,"read");
    (this->data_begin_)._M_off = (streamoff)(local_88._M_dataplus._M_p + 0x18);
    (this->data_begin_)._M_state.__count = 0;
    (this->data_begin_)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    read_bytes._M_p = (pointer)0x38;
    if (local_88._M_dataplus._M_p < (pointer)0x38) {
      read_bytes._M_p = local_88._M_dataplus._M_p;
    }
    std::istream::seekg(pfVar1,0x18,0);
    check_stream(this,"seekg header");
    std::istream::read((char *)pfVar1,(long)&this->header_);
    check_stream(this,"read header");
    Metric::Header::restore(&this->header_,(size_t)read_bytes._M_p);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Byte order mark does not match. File written with different endianess: ","");
  pcVar2 = (this->filename_)._M_pathname._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar2,pcVar2 + (this->filename_)._M_pathname._M_string_length);
  std::operator+(&local_88,&local_48,&local_68);
  std::runtime_error::runtime_error(prVar3,(string *)&local_88);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_preamble()
    {
        const auto read_magic_bytes = read<std::array<char, 8>>();
        if (!std::equal(read_magic_bytes.begin(), read_magic_bytes.end(), magic_bytes.begin()))
        {
            throw std::runtime_error("Magic bytes of file do not match. Invalid or corrupt file:"s +
                                     filename_.string());
        }
        const auto read_bom = read<uint64_t>();
        if (read_bom != byte_order_mark)
        {
            throw std::runtime_error("Byte order mark does not match. File written with "
                                     "different endianess: "s +
                                     filename_.string());
        }

        const auto header_size = read<uint64_t>();
        data_begin_ = header_begin_ + header_size;

        auto read_size =
            std::min<size_t>(sizeof(header_), data_begin_ - static_cast<pos_type>(header_begin_));
        stream_.seekg(header_begin_);
        check_stream("seekg header");
        stream_.read(reinterpret_cast<char*>(&header_), read_size);
        check_stream("read header");
        header_.restore(read_size);
    }